

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O2

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedFollowOfDesignatedInitializer
          (DiagnosticsReporter *this)

{
  allocator<char> local_d2;
  allocator<char> local_d1;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  DiagnosticDescriptor local_70;
  
  std::__cxx11::string::string
            (local_90,(string *)&ID_of_ExpectedFollowOfDesignatedInitializer_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"[[obsolete array designator syntax]]",&local_d1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"obsolete array designator without `=\'",&local_d2);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_70,local_90,local_b0,local_d0,1,1);
  diagnoseOrDelayDiagnostic(this,&local_70);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_70);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedFollowOfDesignatedInitializer()
{
    diagnoseOrDelayDiagnostic(DiagnosticDescriptor(ID_of_ExpectedFollowOfDesignatedInitializer,
                                                   "[[obsolete array designator syntax]]",
                                                   "obsolete array designator without `='",
                                                   DiagnosticSeverity::Warning,
                                                   DiagnosticCategory::Syntax));
}